

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r3d.hpp
# Opt level: O3

Plane<3> *
r3d::tet_face_from_verts(Plane<3> *__return_storage_ptr__,Vector<3> *a,Vector<3> *b,Vector<3> *c)

{
  double dVar1;
  Int i;
  long lVar2;
  Vector<3> normal;
  Vector<3> c_5;
  Vector<3> c_4;
  Vector<3> center;
  Vector<3> c_1;
  Vector<3> c_2;
  double local_1f8;
  UninitT UStack_1f0;
  UninitT local_1e8;
  double local_1d8 [4];
  double local_1b8 [4];
  double local_198 [4];
  double local_178 [4];
  double local_158 [4];
  UninitT local_138 [4];
  UninitT local_118 [4];
  UninitT local_f8 [4];
  UninitT local_d8 [4];
  UninitT local_b8 [4];
  UninitT local_98 [4];
  UninitT local_78 [4];
  undefined1 local_58 [16];
  double local_48;
  double adStack_38 [4];
  double local_18;
  double local_10;
  
  local_78[2] = (a->super_Few<double,_3>).array_[2];
  local_78[0] = (a->super_Few<double,_3>).array_[0];
  local_78[1] = (a->super_Few<double,_3>).array_[1];
  local_98[0] = (b->super_Few<double,_3>).array_[0];
  local_98[1] = (b->super_Few<double,_3>).array_[1];
  local_98[2] = (b->super_Few<double,_3>).array_[2];
  local_178[0] = 0.0;
  local_178[1] = 0.0;
  local_178[2] = 0.0;
  lVar2 = 0;
  do {
    local_178[lVar2] = (double)local_78[lVar2] + (double)local_98[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_b8[2] = (c->super_Few<double,_3>).array_[2];
  local_b8[0] = (c->super_Few<double,_3>).array_[0];
  local_b8[1] = (c->super_Few<double,_3>).array_[1];
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  local_158[2] = 0.0;
  lVar2 = 0;
  do {
    local_158[lVar2] = local_178[lVar2] + (double)local_b8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_198[0] = 0.0;
  local_198[1] = 0.0;
  local_198[2] = 0.0;
  lVar2 = 0;
  do {
    local_198[lVar2] = local_158[lVar2] * 0.3333333333333333;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_d8[2] = (b->super_Few<double,_3>).array_[2];
  local_d8[0] = (b->super_Few<double,_3>).array_[0];
  local_d8[1] = (b->super_Few<double,_3>).array_[1];
  local_f8[0] = (a->super_Few<double,_3>).array_[0];
  local_f8[1] = (a->super_Few<double,_3>).array_[1];
  local_f8[2] = (a->super_Few<double,_3>).array_[2];
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  lVar2 = 0;
  do {
    local_1b8[lVar2] = (double)local_d8[lVar2] - (double)local_f8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_118[2] = (c->super_Few<double,_3>).array_[2];
  local_118[0] = (c->super_Few<double,_3>).array_[0];
  local_118[1] = (c->super_Few<double,_3>).array_[1];
  local_138[0] = (a->super_Few<double,_3>).array_[0];
  local_138[1] = (a->super_Few<double,_3>).array_[1];
  local_138[2] = (a->super_Few<double,_3>).array_[2];
  local_1d8[0] = 0.0;
  local_1d8[1] = 0.0;
  local_1d8[2] = 0.0;
  lVar2 = 0;
  do {
    local_1d8[lVar2] = (double)local_118[lVar2] - (double)local_138[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  dVar1 = local_1d8[2] * local_1b8[1] - local_1b8[2] * local_1d8[1];
  local_18 = local_1d8[0] * local_1b8[2] - local_1b8[0] * local_1d8[2];
  local_48 = local_1b8[0] * local_1d8[1] - local_1d8[0] * local_1b8[1];
  local_58._8_4_ = SUB84(local_18,0);
  local_58._0_8_ = dVar1;
  local_58._12_4_ = (int)((ulong)local_18 >> 0x20);
  local_10 = local_48;
  adStack_38[1] = local_18;
  adStack_38[2] = local_48;
  dVar1 = dVar1 * dVar1;
  lVar2 = 1;
  do {
    dVar1 = dVar1 + adStack_38[lVar2 + 3] * adStack_38[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  local_1f8 = 0.0;
  UStack_1f0 = (UninitT)0x0;
  local_1e8 = (UninitT)0x0;
  lVar2 = 0;
  do {
    (&local_1f8)[lVar2] = *(double *)(local_58 + lVar2 * 8) / dVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_198[0] = local_1f8 * local_198[0];
  lVar2 = 1;
  do {
    local_198[0] = local_198[0] + (&local_1f8)[lVar2] * local_198[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->n).super_Few<double,_3>.array_[2] = local_1e8;
  *(double *)(__return_storage_ptr__->n).super_Few<double,_3>.array_[0].__data = local_1f8;
  (__return_storage_ptr__->n).super_Few<double,_3>.array_[1] = UStack_1f0;
  __return_storage_ptr__->d = -local_198[0];
  return __return_storage_ptr__;
}

Assistant:

R3D_INLINE Plane<3> tet_face_from_verts(Vector<3> a, Vector<3> b, Vector<3> c) {
  auto center = ONE_THIRD * (a + b + c);
  auto normal = normalize(cross((b - a), (c - a)));
  auto d = -(normal * center);
  return Plane<3>{normal, d};
}